

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_get_quantize_level(fitsfile *fptr,float *qlevel,int *status)

{
  float fVar1;
  
  fVar1 = fptr->Fptr->request_quantize_level;
  *qlevel = (float)(~-(uint)(fVar1 == 9999.0) & (uint)fVar1);
  return *status;
}

Assistant:

int fits_get_quantize_level(fitsfile *fptr,  /* I - FITS file pointer   */
           float *qlevel,       /* quantize level parameter value       */
           int *status)         /* IO - error status                */
{
/*
   This routine returns the value of the noice_bits parameter that
   should be used when compressing floating point images.  The image is
   divided into tiles, and each tile is compressed and stored in a row
   of at variable length binary table column.
*/

    if ((fptr->Fptr)->request_quantize_level == NO_QUANTIZE) {
      *qlevel = 0;
    } else {
      *qlevel = (fptr->Fptr)->request_quantize_level;
    }

    return(*status);
}